

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = *(uint *)this;
  pcVar2 = *it + *(uint *)(this + 4);
  pcVar3 = pcVar2;
  uVar6 = uVar7;
  if (99 < uVar7) {
    do {
      uVar6 = uVar7 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar7 % 100) * 2);
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar7;
      uVar7 = uVar7 / 100;
    } while (bVar1);
  }
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar4 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[(ulong)uVar6 * 2];
    lVar4 = -2;
  }
  pcVar3[lVar4] = bVar5;
  *it = pcVar2;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal(it, abs_value, num_digits);
      }